

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

int countDistanceSince(deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_> *history,
                      TaskIdentifier task)

{
  size_type sVar1;
  reference pTVar2;
  uint uVar3;
  ulong uVar4;
  
  sVar1 = std::deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::size(history);
  uVar4 = sVar1 & 0xffffffff;
  do {
    uVar4 = uVar4 - 1;
    uVar3 = (int)sVar1 - 1;
    sVar1 = (size_type)uVar3;
    if ((int)uVar3 < 0) {
      return 10;
    }
    pTVar2 = std::_Deque_iterator<AI::TaskIdentifier,_AI::TaskIdentifier_&,_AI::TaskIdentifier_*>::
             operator[](&(history->
                         super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>)
                         ._M_impl.super__Deque_impl_data._M_start,(ulong)((uint)uVar4 & 0x7fffffff))
    ;
  } while (*pTVar2 != task);
  sVar1 = std::deque<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::size(history);
  return (int)sVar1 - uVar3;
}

Assistant:

int countDistanceSince(std::deque<TaskIdentifier>& history, TaskIdentifier task)
{
	for (int i = history.size() - 1; i >= 0; i--)
	{
		if (history[i] == task)
		{
			return history.size() - i;
		}
	}

	return 10;
}